

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O1

bool dg::pta::PointerAnalysisFSInv::containsRemovableLocals(PSNode *where,PointsToSetT *S)

{
  ulong uVar1;
  PSNode *nd;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *pvVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  const_iterator __begin2;
  const_iterator local_50;
  PSNode *local_38;
  
  local_50.container_it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
       (S->pointers)._bits.
       super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
       .
       super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ._M_h._M_before_begin._M_nxt;
  local_50.container_end.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)(__node_type *)0x0
  ;
  local_50.pos = 0;
  if ((S->pointers)._bits.
      super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
      .
      super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ._M_h._M_element_count != 0) {
    uVar1 = *(ulong *)((long)&(((__node_type *)
                               local_50.container_it.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                               ._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                              ._M_storage._M_storage + 8);
    if ((uVar1 & 1) == 0) {
      local_50.pos = 0;
      do {
        if (local_50.pos == 0x3f) {
          local_50.pos = 0x40;
          break;
        }
        bVar3 = (byte)local_50.pos;
        local_50.pos = local_50.pos + 1;
      } while ((uVar1 >> (bVar3 & 0x3f) & 2) == 0);
    }
    else {
      local_50.pos = 0;
    }
  }
  bVar5 = local_50.pos != 0 ||
          local_50.container_it.
          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur !=
          (__node_type *)0x0;
  if (local_50.pos != 0 ||
      local_50.container_it.
      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur !=
      (__node_type *)0x0) {
    local_38 = where;
    do {
      nd = *(PSNode **)
            ((long)((_Hash_node_base *)
                   ((long)local_50.container_it.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                          ._M_cur + 8))->_M_nxt * 0x10 + -0x10 + local_50.pos * 0x10 + _getConstant)
      ;
      iVar4 = 3;
      if (((nd != NULLPTR) && (nd != UNKNOWN_MEMORY)) && (nd != INVALIDATED)) {
        if (((nd != (PSNode *)0x0) && (*(int *)(nd + 0x90) == 1)) &&
           ((nd[0xe9] == (PSNode)0x0 &&
            ((nd[0xea] == (PSNode)0x0 && (*(long *)(nd + 0xa0) == *(long *)(local_38 + 0xa0))))))) {
          iVar4 = 1;
          if ((*(PointerSubgraph **)(nd + 0xa0) == (PointerSubgraph *)0x0) ||
             (pvVar2 = PointerSubgraph::getLoop(*(PointerSubgraph **)(nd + 0xa0),nd),
             pvVar2 == (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x0))
          goto LAB_0011419b;
        }
        iVar4 = 0;
      }
LAB_0011419b:
      if ((iVar4 != 3) && (iVar4 != 0)) {
        return bVar5;
      }
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::const_iterator::operator++(&local_50);
      bVar5 = local_50.container_it.
              super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
              != (__node_type *)0x0 || local_50.pos != 0;
    } while (local_50.container_it.
             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
             != (__node_type *)0x0 || local_50.pos != 0);
  }
  return bVar5;
}

Assistant:

static bool containsRemovableLocals(PSNode *where, PointsToSetT &S) {
        for (const auto &ptr : S) {
            if (ptr.isNull() || ptr.isUnknown() || ptr.isInvalidated())
                continue;

            if (PSNodeAlloc *alloc = PSNodeAlloc::get(ptr.target)) {
                if (isLocal(alloc, where) && knownInstance(alloc))
                    return true;
            }
        }

        return false;
    }